

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O0

void __thiscall
utf8_valid_4_bytes_f0_Test::~utf8_valid_4_bytes_f0_Test(utf8_valid_4_bytes_f0_Test *this)

{
  utf8_valid_4_bytes_f0_Test *this_local;
  
  ~utf8_valid_4_bytes_f0_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(utf8, valid_4_bytes_f0) {
  int cu0 = 0xf0;
  FOR_EACH_BYTE(cu1) {
    FOR_EACH_BYTE(cu2) {
      FOR_EACH_BYTE(cu3) {
        bool is_valid = is_in_range(cu1, 0x90, 0xc0) &&
                        is_in_range(cu2, 0x80, 0xc0) &&
                        is_in_range(cu3, 0x80, 0xc0);
        assert_is_valid_utf8(is_valid, 4, cu0, cu1, cu2, cu3);
      }
    }
  }
}